

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O3

bool basisu::unpack_bc7_mode1_3_7(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  byte bVar1;
  undefined4 *puVar2;
  bool bVar3;
  uint32_t bits;
  uint uVar4;
  uint uVar5;
  uint8_t uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  byte *pbVar12;
  uint32_t total_bits_1;
  char *__assertion;
  uint32_t bits_1;
  uint uVar13;
  ulong uVar14;
  uint32_t total_bits;
  uint uVar15;
  uint32_t total_bits_2;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint8_t *puVar19;
  uint32_t c;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  color_rgba endpoints [4];
  uint32_t pbits [4];
  color_rgba block_colors [2] [8];
  uint32_t weights [16];
  byte local_d8 [4];
  byte local_d4 [12];
  uint auStack_c8 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_b8 [16];
  uint auStack_78 [18];
  
  bVar22 = mode == 1;
  uVar5 = 5;
  if (mode != 7) {
    uVar5 = bVar22 ^ 7;
  }
  uVar10 = mode + 1;
  if (0x20 < uVar10) {
    __assert_fail("codesize <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                  ,0x71,"uint32_t basisu::read_bits32(const uint8_t *, uint32_t &, uint32_t)");
  }
  uVar15 = 0;
  if (uVar10 == 0) {
    uVar14 = 0;
  }
  else {
    uVar21 = (ulong)(mode == 7) + 3;
    uVar13 = bVar22 | 2;
    uVar4 = 0;
    uVar11 = 0;
    do {
      uVar7 = (uint)uVar11 & 7;
      iVar16 = 8 - uVar7;
      if ((int)(uVar10 - uVar4) < iVar16) {
        iVar16 = uVar10 - uVar4;
      }
      uVar15 = uVar15 | (~(-1 << ((byte)iVar16 & 0x1f)) &
                        (uint)(*(byte *)((long)pBlock_bits + (uVar11 >> 3)) >> (sbyte)uVar7)) <<
                        ((byte)uVar4 & 0x1f);
      uVar4 = uVar4 + iVar16;
      uVar11 = (ulong)(iVar16 + (uint)uVar11);
    } while (uVar4 < uVar10);
    uVar14 = 0;
    if (uVar15 == 1 << ((byte)mode & 0x1f)) {
      uVar10 = 0;
      do {
        uVar4 = (uint)uVar11 & 7;
        uVar15 = 8 - uVar4;
        if (6 - uVar10 < uVar15) {
          uVar15 = 6 - uVar10;
        }
        uVar4 = (uint)uVar14 |
                (~(-1 << ((byte)uVar15 & 0x1f)) &
                (uint)(*(byte *)((long)pBlock_bits + (uVar11 >> 3)) >> (sbyte)uVar4)) <<
                ((byte)uVar10 & 0x1f);
        uVar14 = (ulong)uVar4;
        uVar10 = uVar10 + uVar15;
        uVar11 = (ulong)(uVar15 + (uint)uVar11);
      } while (uVar10 < 6);
      uVar20 = 0;
      do {
        lVar9 = 0;
        do {
          uVar15 = 0;
          uVar10 = 0;
          do {
            uVar17 = (uint)uVar11;
            uVar7 = uVar17 & 7;
            iVar18 = uVar5 - uVar10;
            iVar16 = 8 - uVar7;
            if (iVar18 < (int)(8 - uVar7)) {
              iVar16 = iVar18;
            }
            uVar15 = uVar15 | (~(-1 << ((byte)iVar16 & 0x1f)) &
                              (uint)(*(byte *)((long)pBlock_bits + (uVar11 >> 3)) >> (sbyte)uVar7))
                              << ((byte)uVar10 & 0x1f);
            uVar10 = uVar10 + iVar16;
            uVar11 = (ulong)(iVar16 + uVar17);
          } while (uVar10 < uVar5);
          if (3 < uVar20) {
LAB_0024539c:
            __assert_fail("index < 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0x375,"uint8_t &basisu::color_rgba::operator[](uint32_t)");
          }
          local_d8[lVar9 * 4 + uVar20] = (byte)uVar15;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar21);
      iVar16 = 8 - uVar7;
      if (iVar18 < (int)(8 - uVar7)) {
        iVar16 = iVar18;
      }
      lVar9 = 0;
      do {
        uVar10 = iVar16 + uVar17 + (int)lVar9;
        auStack_c8[lVar9] =
             (uint)((*(byte *)((long)pBlock_bits + (ulong)(uVar10 >> 3)) >> (uVar10 & 7) & 1) != 0);
        lVar9 = lVar9 + 1;
      } while ((ulong)!bVar22 * 2 + 2 != lVar9);
      iVar16 = 8 - uVar7;
      if (iVar18 < (int)(8 - uVar7)) {
        iVar16 = iVar18;
      }
      uVar10 = uVar17 + (int)lVar9 + iVar16;
      uVar11 = 0;
      do {
        uVar15 = uVar13 - 1;
        if ((uVar11 != 0) &&
           (uVar15 = uVar13, uVar11 == (byte)basist::g_bc7_table_anchor_index_second_subset[uVar14])
           ) {
          uVar15 = uVar13 - 1;
        }
        uVar7 = 0;
        uVar17 = 0;
        do {
          iVar16 = 8 - (uVar10 & 7);
          if ((int)(uVar15 - uVar17) < iVar16) {
            iVar16 = uVar15 - uVar17;
          }
          uVar7 = uVar7 | (~(-1 << ((byte)iVar16 & 0x1f)) &
                          (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar10 >> 3)) >>
                                (sbyte)(uVar10 & 7))) << ((byte)uVar17 & 0x1f);
          uVar17 = uVar17 + iVar16;
          uVar10 = iVar16 + uVar10;
        } while (uVar17 < uVar15);
        auStack_78[uVar11] = uVar7;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x10);
      if (uVar10 != 0x80) {
        __assert_fail("bit_offset == 128",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                      ,0x216,
                      "bool basisu::unpack_bc7_mode1_3_7(uint32_t, const void *, color_rgba *)");
      }
      bVar1 = (byte)uVar5;
      pbVar12 = local_d8;
      lVar9 = 0;
      do {
        uVar14 = 0;
        do {
          uVar5 = 0xff;
          if (uVar21 != uVar14) {
            if (pbVar12[uVar14] >> bVar1 != 0) {
              __assertion = "val < (1U << val_bits)";
LAB_00245412:
              __assert_fail(__assertion,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                            ,0x1b0,"uint32_t basisu::bc7_dequant(uint32_t, uint32_t, uint32_t)");
            }
            if (1 < auStack_c8[(uint)lVar9 >> (mode == 1)]) {
              __assertion = "pbit < 2";
              goto LAB_00245412;
            }
            uVar5 = auStack_c8[(uint)lVar9 >> (mode == 1)] + (uint)pbVar12[uVar14] * 2 <<
                    (bVar1 ^ 7);
            uVar5 = uVar5 >> bVar1 + 1 | uVar5;
            if (0xff < uVar5) {
              __assertion = "val <= 255";
              goto LAB_00245412;
            }
          }
          pbVar12[uVar14] = (byte)uVar5;
          uVar14 = uVar14 + 1;
        } while (uVar14 != 4);
        lVar9 = lVar9 + 1;
        pbVar12 = pbVar12 + 4;
      } while (lVar9 != 4);
      lVar9 = 0;
      bVar22 = true;
      do {
        bVar3 = bVar22;
        lVar8 = lVar9 * 0x20;
        puVar19 = local_b8[0].m_comps + lVar8;
        uVar14 = 0;
        do {
          uVar11 = 0;
          do {
            if (uVar11 == 4) goto LAB_0024539c;
            if (mode == 1) {
              puVar2 = &basist::g_bc7_weights3;
              if (7 < uVar14) {
                __assert_fail("w < 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                              ,0x1b4,"uint32_t basisu::bc7_interp3(uint32_t, uint32_t, uint32_t)");
              }
            }
            else {
              puVar2 = &basist::g_bc7_weights2;
              if (3 < uVar14) {
                __assert_fail("w < 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                              ,0x1b3,"uint32_t basisu::bc7_interp2(uint32_t, uint32_t, uint32_t)");
              }
            }
            puVar19[uVar11] =
                 (uint8_t)((0x40 - puVar2[uVar14]) * (uint)local_d8[uVar11 + lVar9 * 8] +
                           (uint)local_d4[uVar11 + lVar9 * 8] * puVar2[uVar14] + 0x20 >> 6);
            uVar11 = uVar11 + 1;
          } while (uVar21 != uVar11);
          uVar6 = 0xff;
          if (mode == 7) {
            uVar6 = local_b8[0].m_comps[uVar14 * 4 + lVar8 + 3];
          }
          local_b8[0].m_comps[uVar14 * 4 + lVar8 + 3] = uVar6;
          uVar14 = uVar14 + 1;
          puVar19 = puVar19 + 4;
        } while ((uint)uVar14 >> (sbyte)uVar13 == 0);
        lVar9 = 1;
        bVar22 = false;
      } while (bVar3);
      lVar9 = 0;
      do {
        pPixels[lVar9].field_0 =
             local_b8[(ulong)(byte)basist::g_bc7_partition2[lVar9 + (ulong)(uVar4 << 4)] * 8 +
                      (ulong)auStack_78[lVar9]];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10);
      uVar14 = 1;
    }
  }
  return SUB81(uVar14,0);
}

Assistant:

bool unpack_bc7_mode1_3_7(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
	{
		//const uint32_t SUBSETS = 2;
		const uint32_t ENDPOINTS = 4;
		const uint32_t COMPS = (mode == 7) ? 4 : 3;
		const uint32_t WEIGHT_BITS = (mode == 1) ? 3 : 2;
		const uint32_t ENDPOINT_BITS = (mode == 7) ? 5 : ((mode == 1) ? 6 : 7);
		const uint32_t PBITS = (mode == 1) ? 2 : 4;
		const uint32_t SHARED_PBITS = (mode == 1) ? true : false;
		const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
		uint32_t bit_offset = 0;
		const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

		if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

		const uint32_t part = read_bits32(pBuf, bit_offset, 6);

		color_rgba endpoints[ENDPOINTS];
		for (uint32_t c = 0; c < COMPS; c++)
			for (uint32_t e = 0; e < ENDPOINTS; e++)
				endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);
		
		uint32_t pbits[4];
		for (uint32_t p = 0; p < PBITS; p++)
			pbits[p] = read_bits32(pBuf, bit_offset, 1);
						
		uint32_t weights[16];
		for (uint32_t i = 0; i < 16; i++)
			weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == basist::g_bc7_table_anchor_index_second_subset[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);
		
		assert(bit_offset == 128);

		for (uint32_t e = 0; e < ENDPOINTS; e++)
			for (uint32_t c = 0; c < 4; c++)
				endpoints[e][c] = (uint8_t)((c == ((mode == 7U) ? 4U : 3U)) ? 255 : bc7_dequant(endpoints[e][c], pbits[SHARED_PBITS ? (e >> 1) : e], ENDPOINT_BITS));
		
		color_rgba block_colors[2][8];
		for (uint32_t s = 0; s < 2; s++)
			for (uint32_t i = 0; i < WEIGHT_VALS; i++)
			{
				for (uint32_t c = 0; c < COMPS; c++)
					block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
				block_colors[s][i][3] = (COMPS == 3) ? 255 : block_colors[s][i][3];
			}

		for (uint32_t i = 0; i < 16; i++)
			pPixels[i] = block_colors[basist::g_bc7_partition2[part * 16 + i]][weights[i]];

		return true;
	}